

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtspd.c
# Opt level: O0

int main(int argc,char **argv)

{
  uint uVar1;
  long lVar2;
  unsigned_long uVar3;
  int iVar4;
  __pid_t _Var5;
  ulong ulnum_00;
  size_t sVar6;
  uint *puVar7;
  char *pcVar8;
  bool bStack_24b49;
  unsigned_long ulnum;
  char *endptr;
  long pid;
  uint uStack_24b00;
  int arg;
  int error;
  int rc;
  httprequest req;
  char *pidname;
  undefined4 local_98;
  int iStack_94;
  unsigned_short port;
  int flag;
  int wrotepidfile;
  curl_socket_t msgsock;
  curl_socket_t sock;
  srvr_sockaddr_union_t me;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  wrotepidfile = -1;
  flag = -1;
  iStack_94 = 0;
  pidname._6_2_ = 8999;
  req.rtp_buffersize = (size_t)anon_var_dwarf_5dd8;
  pid._4_4_ = 1;
  me._104_8_ = argv;
  argv_local._0_4_ = argc;
  memset(&error,0,0x24a50);
  iVar4 = pid._4_4_;
  while (pid._4_4_ = iVar4, pid._4_4_ < (int)argv_local) {
    iVar4 = strcmp("--version",*(char **)(me._104_8_ + (long)pid._4_4_ * 8));
    if (iVar4 == 0) {
      curl_mprintf("rtspd IPv4%s\n","/IPv6");
      return 0;
    }
    iVar4 = strcmp("--pidfile",*(char **)(me._104_8_ + (long)pid._4_4_ * 8));
    if (iVar4 == 0) {
      iVar4 = pid._4_4_ + 1;
      if (iVar4 < (int)argv_local) {
        req.rtp_buffersize = *(size_t *)(me._104_8_ + (long)iVar4 * 8);
        iVar4 = pid._4_4_ + 2;
      }
    }
    else {
      iVar4 = strcmp("--logfile",*(char **)(me._104_8_ + (long)pid._4_4_ * 8));
      if (iVar4 == 0) {
        iVar4 = pid._4_4_ + 1;
        if (iVar4 < (int)argv_local) {
          serverlogfile = *(char **)(me._104_8_ + (long)iVar4 * 8);
          iVar4 = pid._4_4_ + 2;
        }
      }
      else {
        iVar4 = strcmp("--ipv4",*(char **)(me._104_8_ + (long)pid._4_4_ * 8));
        if (iVar4 == 0) {
          ipv_inuse = "IPv4";
          use_ipv6 = false;
          iVar4 = pid._4_4_ + 1;
        }
        else {
          iVar4 = strcmp("--ipv6",*(char **)(me._104_8_ + (long)pid._4_4_ * 8));
          if (iVar4 == 0) {
            ipv_inuse = "IPv6";
            use_ipv6 = true;
            iVar4 = pid._4_4_ + 1;
          }
          else {
            iVar4 = strcmp("--port",*(char **)(me._104_8_ + (long)pid._4_4_ * 8));
            if (iVar4 == 0) {
              pid._4_4_ = pid._4_4_ + 1;
              iVar4 = pid._4_4_;
              if (pid._4_4_ < (int)argv_local) {
                ulnum_00 = strtoul(*(char **)(me._104_8_ + (long)pid._4_4_ * 8),(char **)&ulnum,10);
                uVar3 = ulnum;
                lVar2 = *(long *)(me._104_8_ + (long)pid._4_4_ * 8);
                sVar6 = strlen(*(char **)(me._104_8_ + (long)pid._4_4_ * 8));
                if (((uVar3 != lVar2 + sVar6) || (ulnum_00 < 0x401)) || (0xffff < ulnum_00)) {
                  curl_mfprintf(_stderr,"rtspd: invalid --port argument (%s)\n",
                                *(undefined8 *)(me._104_8_ + (long)pid._4_4_ * 8));
                  return 0;
                }
                pidname._6_2_ = curlx_ultous(ulnum_00);
                iVar4 = pid._4_4_ + 1;
              }
            }
            else {
              iVar4 = strcmp("--srcdir",*(char **)(me._104_8_ + (long)pid._4_4_ * 8));
              if (iVar4 != 0) {
                puts(
                    "Usage: rtspd [option]\n --version\n --logfile [file]\n --pidfile [file]\n --ipv4\n --ipv6\n --port [port]\n --srcdir [path]"
                    );
                return 0;
              }
              iVar4 = pid._4_4_ + 1;
              if (iVar4 < (int)argv_local) {
                path = *(char **)(me._104_8_ + (long)iVar4 * 8);
                iVar4 = pid._4_4_ + 2;
              }
            }
          }
        }
      }
    }
  }
  install_signal_handlers();
  _Var5 = getpid();
  endptr = (char *)(long)_Var5;
  if ((use_ipv6 & 1U) == 0) {
    wrotepidfile = socket(2,1,0);
  }
  else {
    wrotepidfile = socket(10,1,0);
  }
  if (wrotepidfile == -1) {
    puVar7 = (uint *)__errno_location();
    uVar1 = *puVar7;
    uStack_24b00 = uVar1;
    pcVar8 = strerror(uVar1);
    logmsg("Error creating socket: (%d) %s",(ulong)uVar1,pcVar8);
  }
  else {
    local_98 = 1;
    iVar4 = setsockopt(wrotepidfile,1,2,&local_98,4);
    if (iVar4 == 0) {
      if ((use_ipv6 & 1U) == 0) {
        memset(&msgsock,0,0x10);
        msgsock._0_2_ = 2;
        sock = 0;
        msgsock._2_2_ = htons(pidname._6_2_);
        arg = bind(wrotepidfile,(sockaddr *)&msgsock,0x10);
      }
      else {
        memset(&msgsock,0,0x1c);
        msgsock._0_2_ = 10;
        me._0_8_ = _in6addr_any;
        me._8_1_ = poll;
        me._9_1_ = poll_1;
        me._10_1_ = uRam0000000000131142;
        me._11_1_ = uRam0000000000131143;
        me._12_1_ = uRam0000000000131144;
        me._13_1_ = uRam0000000000131145;
        me._14_1_ = uRam0000000000131146;
        me._15_1_ = uRam0000000000131147;
        msgsock._2_2_ = htons(pidname._6_2_);
        arg = bind(wrotepidfile,(sockaddr *)&msgsock,0x1c);
      }
      if (arg == 0) {
        logmsg("Running %s version on port %d",ipv_inuse,(ulong)pidname._6_2_);
        arg = listen(wrotepidfile,5);
        if (arg == 0) {
          iStack_94 = write_pidfile((char *)req.rtp_buffersize);
          if (iStack_94 != 0) {
            do {
              flag = accept(wrotepidfile,(sockaddr *)0x0,(socklen_t *)0x0);
              if (got_exit_signal != 0) break;
              if (flag == -1) {
                puVar7 = (uint *)__errno_location();
                uVar1 = *puVar7;
                uStack_24b00 = uVar1;
                pcVar8 = strerror(uVar1);
                logmsg("MAJOR ERROR: accept() failed with error: (%d) %s",(ulong)uVar1,pcVar8);
                break;
              }
              set_advisor_read_lock("log/serverlogs.lock");
              serverlogslocked = 1;
              logmsg("====> Client connect");
              local_98 = 1;
              iVar4 = setsockopt(flag,6,1,&local_98,4);
              if (iVar4 == -1) {
                logmsg("====> TCP_NODELAY failed");
              }
              do {
                if ((got_exit_signal != 0) ||
                   (iVar4 = get_request(flag,(httprequest *)&error), iVar4 != 0)) break;
                if ((prevbounce & 1U) != 0) {
                  if ((req.offset == prevtestno) && (req.testno == prevpartno)) {
                    req.testno = req.testno + 1;
                    logmsg("BOUNCE part number to %ld",req.testno);
                  }
                  else {
                    prevbounce = false;
                    prevtestno = -1;
                    prevpartno = -1;
                  }
                }
                send_doc(flag,(httprequest *)&error);
                if (got_exit_signal != 0) break;
                if (((long)req.offset < 0) && (req.offset != 0xfffffffffffffffd)) {
                  logmsg("special request received, no persistency");
                  break;
                }
                if (((byte)req.partno & 1) == 0) {
                  logmsg("instructed to close connection after server-reply");
                  break;
                }
                if (((byte)req.partno & 1) != 0) {
                  logmsg("=> persistent connection request ended, awaits new request");
                }
                bStack_24b49 = ((byte)req.partno & 1) != 0 || req.offset == 0xfffffffffffffffd;
              } while (bStack_24b49);
              if (got_exit_signal != 0) break;
              logmsg("====> Client disconnect");
              close(flag);
              flag = -1;
              if (serverlogslocked != 0) {
                serverlogslocked = 0;
                clear_advisor_read_lock("log/serverlogs.lock");
              }
            } while (req.offset != 0xfffffffffffffffa);
          }
        }
        else {
          puVar7 = (uint *)__errno_location();
          uVar1 = *puVar7;
          uStack_24b00 = uVar1;
          pcVar8 = strerror(uVar1);
          logmsg("listen() failed with error: (%d) %s",(ulong)uVar1,pcVar8);
        }
      }
      else {
        puVar7 = (uint *)__errno_location();
        uVar1 = *puVar7;
        uStack_24b00 = uVar1;
        pcVar8 = strerror(uVar1);
        logmsg("Error binding socket on port %hu: (%d) %s",(ulong)pidname._6_2_,(ulong)uVar1,pcVar8)
        ;
      }
    }
    else {
      puVar7 = (uint *)__errno_location();
      uVar1 = *puVar7;
      uStack_24b00 = uVar1;
      pcVar8 = strerror(uVar1);
      logmsg("setsockopt(SO_REUSEADDR) failed with error: (%d) %s",(ulong)uVar1,pcVar8);
    }
  }
  if ((flag != wrotepidfile) && (flag != -1)) {
    close(flag);
  }
  if (wrotepidfile != -1) {
    close(wrotepidfile);
  }
  if (got_exit_signal != 0) {
    logmsg("signalled to die");
  }
  if (iStack_94 != 0) {
    unlink((char *)req.rtp_buffersize);
  }
  if (serverlogslocked != 0) {
    serverlogslocked = 0;
    clear_advisor_read_lock("log/serverlogs.lock");
  }
  restore_signal_handlers();
  if (got_exit_signal != 0) {
    logmsg("========> %s rtspd (port: %d pid: %ld) exits with signal (%d)",ipv_inuse,
           (ulong)pidname._6_2_,endptr,(ulong)(uint)exit_signal);
    raise(exit_signal);
  }
  logmsg("========> rtspd quits");
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
  srvr_sockaddr_union_t me;
  curl_socket_t sock = CURL_SOCKET_BAD;
  curl_socket_t msgsock = CURL_SOCKET_BAD;
  int wrotepidfile = 0;
  int flag;
  unsigned short port = DEFAULT_PORT;
  const char *pidname = ".rtsp.pid";
  struct httprequest req;
  int rc;
  int error;
  int arg = 1;
  long pid;

  memset(&req, 0, sizeof(req));

  while(argc>arg) {
    if(!strcmp("--version", argv[arg])) {
      printf("rtspd IPv4%s"
             "\n"
             ,
#ifdef ENABLE_IPV6
             "/IPv6"
#else
             ""
#endif
             );
      return 0;
    }
    else if(!strcmp("--pidfile", argv[arg])) {
      arg++;
      if(argc>arg)
        pidname = argv[arg++];
    }
    else if(!strcmp("--logfile", argv[arg])) {
      arg++;
      if(argc>arg)
        serverlogfile = argv[arg++];
    }
    else if(!strcmp("--ipv4", argv[arg])) {
#ifdef ENABLE_IPV6
      ipv_inuse = "IPv4";
      use_ipv6 = FALSE;
#endif
      arg++;
    }
    else if(!strcmp("--ipv6", argv[arg])) {
#ifdef ENABLE_IPV6
      ipv_inuse = "IPv6";
      use_ipv6 = TRUE;
#endif
      arg++;
    }
    else if(!strcmp("--port", argv[arg])) {
      arg++;
      if(argc>arg) {
        char *endptr;
        unsigned long ulnum = strtoul(argv[arg], &endptr, 10);
        if((endptr != argv[arg] + strlen(argv[arg])) ||
           (ulnum < 1025UL) || (ulnum > 65535UL)) {
          fprintf(stderr, "rtspd: invalid --port argument (%s)\n",
                  argv[arg]);
          return 0;
        }
        port = curlx_ultous(ulnum);
        arg++;
      }
    }
    else if(!strcmp("--srcdir", argv[arg])) {
      arg++;
      if(argc>arg) {
        path = argv[arg];
        arg++;
      }
    }
    else {
      puts("Usage: rtspd [option]\n"
           " --version\n"
           " --logfile [file]\n"
           " --pidfile [file]\n"
           " --ipv4\n"
           " --ipv6\n"
           " --port [port]\n"
           " --srcdir [path]");
      return 0;
    }
  }

#ifdef WIN32
  win32_init();
  atexit(win32_cleanup);
#endif

  install_signal_handlers();

  pid = (long)getpid();

#ifdef ENABLE_IPV6
  if(!use_ipv6)
#endif
    sock = socket(AF_INET, SOCK_STREAM, 0);
#ifdef ENABLE_IPV6
  else
    sock = socket(AF_INET6, SOCK_STREAM, 0);
#endif

  if(CURL_SOCKET_BAD == sock) {
    error = SOCKERRNO;
    logmsg("Error creating socket: (%d) %s",
           error, strerror(error));
    goto server_cleanup;
  }

  flag = 1;
  if(0 != setsockopt(sock, SOL_SOCKET, SO_REUSEADDR,
            (void *)&flag, sizeof(flag))) {
    error = SOCKERRNO;
    logmsg("setsockopt(SO_REUSEADDR) failed with error: (%d) %s",
           error, strerror(error));
    goto server_cleanup;
  }

#ifdef ENABLE_IPV6
  if(!use_ipv6) {
#endif
    memset(&me.sa4, 0, sizeof(me.sa4));
    me.sa4.sin_family = AF_INET;
    me.sa4.sin_addr.s_addr = INADDR_ANY;
    me.sa4.sin_port = htons(port);
    rc = bind(sock, &me.sa, sizeof(me.sa4));
#ifdef ENABLE_IPV6
  }
  else {
    memset(&me.sa6, 0, sizeof(me.sa6));
    me.sa6.sin6_family = AF_INET6;
    me.sa6.sin6_addr = in6addr_any;
    me.sa6.sin6_port = htons(port);
    rc = bind(sock, &me.sa, sizeof(me.sa6));
  }
#endif /* ENABLE_IPV6 */
  if(0 != rc) {
    error = SOCKERRNO;
    logmsg("Error binding socket on port %hu: (%d) %s",
           port, error, strerror(error));
    goto server_cleanup;
  }

  logmsg("Running %s version on port %d", ipv_inuse, (int)port);

  /* start accepting connections */
  rc = listen(sock, 5);
  if(0 != rc) {
    error = SOCKERRNO;
    logmsg("listen() failed with error: (%d) %s",
           error, strerror(error));
    goto server_cleanup;
  }

  /*
  ** As soon as this server writes its pid file the test harness will
  ** attempt to connect to this server and initiate its verification.
  */

  wrotepidfile = write_pidfile(pidname);
  if(!wrotepidfile)
    goto server_cleanup;

  for(;;) {
    msgsock = accept(sock, NULL, NULL);

    if(got_exit_signal)
      break;
    if(CURL_SOCKET_BAD == msgsock) {
      error = SOCKERRNO;
      logmsg("MAJOR ERROR: accept() failed with error: (%d) %s",
             error, strerror(error));
      break;
    }

    /*
    ** As soon as this server acepts a connection from the test harness it
    ** must set the server logs advisor read lock to indicate that server
    ** logs should not be read until this lock is removed by this server.
    */

    set_advisor_read_lock(SERVERLOGS_LOCK);
    serverlogslocked = 1;

    logmsg("====> Client connect");

#ifdef TCP_NODELAY
    /*
     * Disable the Nagle algorithm to make it easier to send out a large
     * response in many small segments to torture the clients more.
     */
    flag = 1;
    if(setsockopt(msgsock, IPPROTO_TCP, TCP_NODELAY,
                   (void *)&flag, sizeof(flag)) == -1) {
      logmsg("====> TCP_NODELAY failed");
    }
#endif

    /* initialization of httprequest struct is done in get_request(), but due
       to pipelining treatment the pipelining struct field must be initialized
       previously to FALSE every time a new connection arrives. */

    req.pipelining = FALSE;

    do {
      if(got_exit_signal)
        break;

      if(get_request(msgsock, &req))
        /* non-zero means error, break out of loop */
        break;

      if(prevbounce) {
        /* bounce treatment requested */
        if((req.testno == prevtestno) &&
           (req.partno == prevpartno)) {
          req.partno++;
          logmsg("BOUNCE part number to %ld", req.partno);
        }
        else {
          prevbounce = FALSE;
          prevtestno = -1;
          prevpartno = -1;
        }
      }

      send_doc(msgsock, &req);
      if(got_exit_signal)
        break;

      if((req.testno < 0) && (req.testno != DOCNUMBER_CONNECT)) {
        logmsg("special request received, no persistency");
        break;
      }
      if(!req.open) {
        logmsg("instructed to close connection after server-reply");
        break;
      }

      if(req.open)
        logmsg("=> persistent connection request ended, awaits new request");
      /* if we got a CONNECT, loop and get another request as well! */
    } while(req.open || (req.testno == DOCNUMBER_CONNECT));

    if(got_exit_signal)
      break;

    logmsg("====> Client disconnect");
    sclose(msgsock);
    msgsock = CURL_SOCKET_BAD;

    if(serverlogslocked) {
      serverlogslocked = 0;
      clear_advisor_read_lock(SERVERLOGS_LOCK);
    }

    if(req.testno == DOCNUMBER_QUIT)
      break;
  }

server_cleanup:

  if((msgsock != sock) && (msgsock != CURL_SOCKET_BAD))
    sclose(msgsock);

  if(sock != CURL_SOCKET_BAD)
    sclose(sock);

  if(got_exit_signal)
    logmsg("signalled to die");

  if(wrotepidfile)
    unlink(pidname);

  if(serverlogslocked) {
    serverlogslocked = 0;
    clear_advisor_read_lock(SERVERLOGS_LOCK);
  }

  restore_signal_handlers();

  if(got_exit_signal) {
    logmsg("========> %s rtspd (port: %d pid: %ld) exits with signal (%d)",
           ipv_inuse, (int)port, pid, exit_signal);
    /*
     * To properly set the return status of the process we
     * must raise the same signal SIGINT or SIGTERM that we
     * caught and let the old handler take care of it.
     */
    raise(exit_signal);
  }

  logmsg("========> rtspd quits");
  return 0;
}